

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode
deleteNode(UA_Server *server,UA_Session *session,UA_NodeId *nodeId,UA_Boolean deleteReferences)

{
  size_t *psVar1;
  undefined8 *puVar2;
  code *pcVar3;
  UA_ReferenceNode *pUVar4;
  UA_StatusCode UVar5;
  UA_NodeStoreEntry **ppUVar6;
  UA_Node *pUVar7;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 uVar8;
  undefined4 extraout_EDX_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar9;
  undefined4 extraout_var_02;
  ulong uVar10;
  long lVar11;
  UA_Node *node;
  size_t local_a8;
  UA_Byte *pUStack_a0;
  size_t local_98;
  UA_Byte *pUStack_90;
  size_t local_88;
  UA_Byte *pUStack_80;
  size_t local_78;
  UA_Byte *pUStack_70;
  size_t local_68;
  UA_Byte *pUStack_60;
  UA_Byte *local_58;
  size_t sStack_50;
  UA_Byte *local_48;
  size_t sStack_40;
  UA_Session *local_38;
  
  ppUVar6 = findNode(server->nodestore,(UA_NodeId *)session);
  if (ppUVar6 == (UA_NodeStoreEntry **)0x0) {
    node = (UA_Node *)0x0;
  }
  else {
    node = &(*ppUVar6)->node;
  }
  if (node == (UA_Node *)0x0) {
    return 0x80340000;
  }
  uVar8 = extraout_EDX;
  uVar9 = extraout_var;
  if ((((node->nodeClass == UA_NODECLASS_OBJECT) &&
       (pUVar7 = getNodeType(server,node), uVar8 = extraout_EDX_00, uVar9 = extraout_var_00,
       pUVar7 != (UA_Node *)0x0)) && (pUVar7->nodeClass == UA_NODECLASS_OBJECTTYPE)) &&
     (pcVar3 = (code *)pUVar7[1].nodeId.identifier.string.data, pcVar3 != (code *)0x0)) {
    (*pcVar3)(node[1].nodeId.identifier.string.length);
    uVar8 = extraout_EDX_01;
    uVar9 = extraout_var_01;
  }
  if ((char)nodeId != '\0') {
    local_48 = (UA_Byte *)0x0;
    sStack_40 = 0;
    local_58 = (UA_Byte *)0x0;
    sStack_50 = 0;
    local_78 = 0;
    local_88 = 0;
    pUStack_80 = (UA_Byte *)0x0;
    local_98 = 0;
    pUStack_90 = (UA_Byte *)0x0;
    local_a8 = 0;
    pUStack_a0 = (UA_Byte *)0x0;
    pUStack_60 = (node->nodeId).identifier.string.data;
    pUStack_70 = *(UA_Byte **)&node->nodeId;
    local_68 = (node->nodeId).identifier.string.length;
    local_38 = session;
    if (node->referencesSize != 0) {
      lVar11 = 0x20;
      uVar10 = 0;
      do {
        pUVar4 = node->references;
        local_78 = CONCAT71(local_78._1_7_,*(undefined1 *)((long)pUVar4 + lVar11 + -8));
        local_98 = *(size_t *)((long)&(pUVar4->referenceTypeId).identifier + lVar11 + 8);
        psVar1 = (size_t *)((long)&(pUVar4->referenceTypeId).namespaceIndex + lVar11);
        local_a8 = *psVar1;
        pUStack_a0 = (UA_Byte *)psVar1[1];
        pUStack_80 = *(UA_Byte **)((long)pUVar4 + lVar11 + -0x10);
        puVar2 = (undefined8 *)((long)pUVar4 + lVar11 + -0x20);
        pUStack_90 = (UA_Byte *)*puVar2;
        local_88 = puVar2[1];
        deleteReference(server,(UA_Session *)&stack0xffffffffffffff58,
                        (UA_DeleteReferencesItem *)CONCAT44(uVar9,uVar8));
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x50;
        uVar8 = extraout_EDX_02;
        uVar9 = extraout_var_02;
        session = local_38;
      } while (uVar10 < node->referencesSize);
    }
  }
  UVar5 = UA_NodeStore_remove(server->nodestore,(UA_NodeId *)session);
  return UVar5;
}

Assistant:

static UA_StatusCode
deleteNode(UA_Server *server, UA_Session *session,
           const UA_NodeId *nodeId, UA_Boolean deleteReferences) {
    const UA_Node *node = UA_NodeStore_get(server->nodestore, nodeId);
    if(!node)
        return UA_STATUSCODE_BADNODEIDUNKNOWN;

    /* TODO: check if the information model consistency is violated */
    /* TODO: Check if the node is a mandatory child of an object */

    /* Destroy an object before removing it */
    if(node->nodeClass == UA_NODECLASS_OBJECT) {
        /* Call the destructor from the object type */
        const UA_ObjectTypeNode *typenode = getObjectNodeType(server, (const UA_ObjectNode*)node);
        if(typenode && typenode->lifecycleManagement.destructor)
            typenode->lifecycleManagement.destructor(*nodeId, ((const UA_ObjectNode*)node)->instanceHandle);
    }

    /* Remove references to the node (not the references in the node that will
     * be deleted anyway) */
    if(deleteReferences)
        removeReferences(server, session, node);

    return UA_NodeStore_remove(server->nodestore, nodeId);
}